

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprite.cpp
# Opt level: O2

uint8_t __thiscall Sprite::get_pixel(Sprite *this,uint8_t tile_id,uint8_t x,uint8_t y)

{
  byte bVar1;
  byte *pbVar2;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  undefined7 in_register_00000031;
  
  pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                     (&this->_data,
                      (ulong)((uint)((int)CONCAT71(in_register_00000031,tile_id) * 0x40 +
                                     (int)CONCAT71(in_register_00000011,x) +
                                    (int)CONCAT71(in_register_00000009,y) * 8) >> 1));
  bVar1 = *pbVar2 & 0xf;
  if ((x & 1) == 0) {
    bVar1 = *pbVar2 >> 4;
  }
  return bVar1;
}

Assistant:

uint8_t Sprite::get_pixel(uint8_t tile_id, uint8_t x, uint8_t y)
{
    size_t pixel_index = ((tile_id * 64) + (y*8) + x);
    size_t byte_index = pixel_index / 2;
    bool lsb = pixel_index % 2;

    if(lsb)
        return _data.at(byte_index) & 0x0F;
    else
        return (_data.at(byte_index) & 0xF0) >> 4;
}